

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int check_bbytes(char *buf,size_t buf_size,char *bb,size_t bb_size)

{
  int iVar1;
  size_t bb_size_local;
  char *bb_local;
  size_t buf_size_local;
  char *buf_local;
  
  if (((bb == (char *)0x0) || (buf_size != bb_size)) || (iVar1 = memcmp(buf,bb,bb_size), iVar1 != 0)
     ) {
    if (bb != (char *)0x0) {
      hex_dump("expected",bb,bb_size);
      mp_dump(bb,bb_size);
    }
    hex_dump("got",buf,buf_size);
    mp_dump(buf,buf_size);
    hex_dump_c(buf,buf_size);
    buf_local._4_4_ = -1;
  }
  else {
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int
check_bbytes(const char *buf, size_t buf_size, const char *bb, size_t bb_size) {
	if (bb == NULL) goto error;
	if (buf_size != bb_size) goto error;
	if (memcmp(buf, bb, bb_size)) goto error;
	return 0;
error:
	if (bb) {
		hex_dump("expected", bb, bb_size);
		mp_dump(bb, bb_size);
	}
	hex_dump("got", (const char *)buf, buf_size);
	mp_dump(buf, buf_size);
	hex_dump_c((const char *)buf, buf_size);
	return -1;
}